

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O2

LatticeComparison __thiscall
wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>_>::compare
          (Stack<wasm::analysis::Flat<unsigned_int>_> *this,Element *a,Element *b)

{
  Element *pEVar1;
  pointer pEVar2;
  LatticeComparison LVar3;
  LatticeComparison LVar4;
  __normal_iterator<const_wasm::analysis::Flat<unsigned_int>::Element_*,_std::vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>_>
  __tmp;
  Element *a_00;
  __normal_iterator<const_wasm::analysis::Flat<unsigned_int>::Element_*,_std::vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>_>
  __tmp_1;
  pointer b_00;
  bool bVar5;
  
  a_00 = (a->
         super__Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  b_00 = (b->
         super__Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  LVar4 = EQUAL;
  while( true ) {
    pEVar1 = (a->
             super__Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pEVar2 = (b->
             super__Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((a_00 == pEVar1) || (b_00 == pEVar2)) break;
    a_00 = a_00 + -1;
    b_00 = b_00 + -1;
    LVar3 = Flat<unsigned_int>::compare((Flat<unsigned_int> *)this,a_00,b_00);
    if (LVar3 == NO_RELATION) {
      return NO_RELATION;
    }
    if (LVar3 == GREATER) {
      bVar5 = LVar4 == LESS;
      LVar4 = LVar3;
      if (bVar5) {
        return NO_RELATION;
      }
    }
    else if ((LVar3 == LESS) && (bVar5 = LVar4 == GREATER, LVar4 = LVar3, bVar5)) {
      return NO_RELATION;
    }
  }
  if (b_00 != pEVar2) {
    LVar4 = LESS;
  }
  if (a_00 != pEVar1) {
    return GREATER;
  }
  return LVar4;
}

Assistant:

LatticeComparison compare(const Element& a, const Element& b) const noexcept {
    auto result = EQUAL;
    // Iterate starting from the end of the vectors to match up the tops of
    // stacks with different sizes.
    for (auto itA = a.rbegin(), itB = b.rbegin();
         itA != a.rend() || itB != b.rend();
         ++itA, ++itB) {
      if (itA == a.rend()) {
        // The rest of A's elements are bottom, but B has a non-bottom element
        // because of our invariant that the base of the materialized stack must
        // not be bottom.
        return LESS;
      }
      if (itB == b.rend()) {
        // The rest of B's elements are bottom, but A has a non-bottom element.
        return GREATER;
      }
      switch (lattice.compare(*itA, *itB)) {
        case NO_RELATION:
          return NO_RELATION;
        case EQUAL:
          continue;
        case LESS:
          if (result == GREATER) {
            // Cannot be both less and greater.
            return NO_RELATION;
          }
          result = LESS;
          continue;
        case GREATER:
          if (result == LESS) {
            // Cannot be both greater and less.
            return NO_RELATION;
          }
          result = GREATER;
          continue;
      }
    }
    return result;
  }